

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  char *pcVar1;
  bool bVar2;
  cmExecutionStatus local_d5;
  allocator local_d1;
  undefined1 local_d0 [3];
  cmExecutionStatus status;
  cmListFileArgument local_b0;
  int local_80;
  int i;
  undefined1 local_70 [8];
  cmListFileFunction lff;
  cmMakefile *mf;
  char **args_local;
  int numArgs_local;
  char *name_local;
  void *arg_local;
  
  lff.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg;
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)local_70);
  std::__cxx11::string::operator=((string *)local_70,name);
  for (local_80 = 0; local_80 < numArgs; local_80 = local_80 + 1) {
    pcVar1 = args[local_80];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d0,pcVar1,&local_d1);
    cmListFileArgument::cmListFileArgument(&local_b0,(string *)local_d0,Quoted,0);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
               &lff.super_cmCommandContext.Line,&local_b0);
    cmListFileArgument::~cmListFileArgument(&local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  cmExecutionStatus::cmExecutionStatus(&local_d5);
  bVar2 = cmMakefile::ExecuteCommand
                    ((cmMakefile *)
                     lff.Arguments.
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (cmListFileFunction *)local_70,&local_d5);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_70);
  return (uint)bVar2;
}

Assistant:

int CCONV cmExecuteCommand(void *arg, const char *name,
                     int numArgs, const char **args)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for(int i = 0; i < numArgs; ++i)
    {
    // Assume all arguments are quoted.
    lff.Arguments.push_back(
      cmListFileArgument(args[i], cmListFileArgument::Quoted, 0));
    }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff,status);
}